

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

int __thiscall particleSamples::decide_to_pick_reconst(particleSamples *this,int monval)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 2;
  if (monval != -0x141) {
    uVar2 = (uint)(monval == 0x141);
  }
  uVar1 = 0;
  if (this->particle_monval == 0x14d) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

int particleSamples::decide_to_pick_reconst(int monval) {
    int flag = 0;
    if (particle_monval == 333) {
        // particle of interest is phi(1020)
        // collect (K^+, K^-) pairs for reconstruction
        if (monval == 321) {  // current particle is K^+ from a decay
            flag = 1;
        }
        if (monval == -321) {  // current particle is K^- from a decay
            flag = 2;
        }
    }
    return (flag);
}